

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O2

bool __thiscall AnyType::OutputFromType<Boolean>(AnyType *this,ostream *os)

{
  bool bVar1;
  undefined1 local_30 [8];
  Boolean t;
  
  t.super_DerBase._vptr_DerBase = (_func_int **)0x0;
  local_30 = (undefined1  [8])&PTR_EncodedSize_00146888;
  t.super_DerBase.cbData._0_1_ = 0;
  bVar1 = ConvertToType<Boolean>(this,(Boolean *)local_30);
  if (bVar1) {
    ::operator<<(os,(Boolean *)local_30);
  }
  return bVar1;
}

Assistant:

bool OutputFromType(std::ostream& os) const 
    {
        T t;
        bool fConverted = ConvertToType(t);
        if (fConverted)
            os << t;

        return fConverted;
    }